

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

void __thiscall Map::Leave(Map *this,Character *character,WarpAnimation animation,bool silent)

{
  bool bVar1;
  int num;
  reference ppCVar2;
  iterator local_b0;
  const_iterator local_a8;
  _List_node_base *local_a0;
  _List_iterator<Character_*> local_98;
  iterator local_90;
  const_iterator local_88;
  Character *local_80;
  Character *checkcharacter;
  iterator __end2;
  iterator __begin2;
  list<Character_*,_std::allocator<Character_*>_> *__range2;
  undefined1 local_50 [8];
  PacketBuilder builder;
  bool silent_local;
  Character *pCStack_18;
  WarpAnimation animation_local;
  Character *character_local;
  Map *this_local;
  
  builder.add_size._6_1_ = silent;
  builder.add_size._7_1_ = animation;
  pCStack_18 = character;
  character_local = (Character *)this;
  if (!silent) {
    PacketBuilder::PacketBuilder((PacketBuilder *)local_50,PACKET_AVATAR,PACKET_REMOVE,3);
    num = Character::PlayerID(pCStack_18);
    PacketBuilder::AddShort((PacketBuilder *)local_50,num);
    if (builder.add_size._7_1_ != WARP_ANIMATION_NONE) {
      PacketBuilder::AddChar((PacketBuilder *)local_50,(uint)builder.add_size._7_1_);
    }
    __end2 = std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::begin(&this->characters)
    ;
    checkcharacter =
         (Character *)
         std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&checkcharacter), bVar1) {
      ppCVar2 = std::_List_iterator<Character_*>::operator*(&__end2);
      local_80 = *ppCVar2;
      if ((local_80 != pCStack_18) && (bVar1 = Character::InRange(pCStack_18,local_80), bVar1)) {
        Character::Send(local_80,(PacketBuilder *)local_50);
      }
      std::_List_iterator<Character_*>::operator++(&__end2);
    }
    PacketBuilder::~PacketBuilder((PacketBuilder *)local_50);
  }
  local_98._M_node =
       (_List_node_base *)
       std::begin<std::__cxx11::list<Character*,std::allocator<Character*>>>(&this->characters);
  local_a0 = (_List_node_base *)
             std::end<std::__cxx11::list<Character*,std::allocator<Character*>>>(&this->characters);
  local_90._M_node =
       (_List_node_base *)
       std::remove<std::_List_iterator<Character*>,Character*>
                 (local_98,(_List_iterator<Character_*>)local_a0,&stack0xffffffffffffffe8);
  std::_List_const_iterator<Character_*>::_List_const_iterator(&local_88,&local_90);
  local_b0._M_node =
       (_List_node_base *)
       std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::end(&this->characters);
  std::_List_const_iterator<Character_*>::_List_const_iterator(&local_a8,&local_b0);
  std::__cxx11::list<Character_*,_std::allocator<Character_*>_>::erase
            (&this->characters,local_88,local_a8);
  pCStack_18->map = (Map *)0x0;
  return;
}

Assistant:

void Map::Leave(Character *character, WarpAnimation animation, bool silent)
{
	if (!silent)
	{
		PacketBuilder builder(PACKET_AVATAR, PACKET_REMOVE, 3);
		builder.AddShort(character->PlayerID());

		if (animation != WARP_ANIMATION_NONE)
		{
			builder.AddChar(animation);
		}

		UTIL_FOREACH(this->characters, checkcharacter)
		{
			if (checkcharacter == character || !character->InRange(checkcharacter))
			{
				continue;
			}

			checkcharacter->Send(builder);
		}
	}

	this->characters.erase(
		std::remove(UTIL_RANGE(this->characters), character),
		this->characters.end()
	);

	character->map = 0;
}